

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tests.cpp
# Opt level: O1

bool __thiscall TestRunner::runTests(TestRunner *this,path *dir,string *executableName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *extraout_RDX;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long lVar4;
  string_view text;
  uint successCount;
  vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> tests;
  string errors;
  string line;
  string testName;
  uint local_d4;
  vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_> local_d0;
  string local_b8;
  string local_98;
  TestRunner *local_78;
  string local_70;
  path local_50;
  
  std::__cxx11::string::_M_assign((string *)this);
  local_78 = this;
  getTestsList(&local_d0,this,dir);
  if (local_d0.super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_d0.super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
    Logger::printLine<>("No tests to run");
  }
  else {
    local_d4 = 0;
    if (local_d0.super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_d0.super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      paVar1 = &local_b8.field_2;
      lVar4 = 0;
      pcVar3 = (pointer)0x0;
      do {
        Logger::print<>("\x1b[1;0m");
        pcVar3 = pcVar3 + 1;
        local_50._path._M_dataplus._M_p =
             (pointer)((long)local_d0.
                             super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_d0.
                             super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
        local_70._M_dataplus._M_p = pcVar3;
        ghc::filesystem::path::u8string_abi_cxx11_
                  (&local_b8,
                   (path *)((long)&((local_d0.
                                     super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_path)._M_dataplus.
                                   _M_p + lVar4));
        tinyformat::format<unsigned_long,unsigned_long,std::__cxx11::string>
                  (&local_98,(tinyformat *)"Test %d of %d, %s:",(char *)&local_70,
                   (unsigned_long *)&local_50,(unsigned_long *)&local_b8,in_R9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        Logger::print<std::__cxx11::string>("%-60s",&local_98);
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        ghc::filesystem::path::filename
                  (&local_50,
                   (path *)((long)&((local_d0.
                                     super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_path)._M_dataplus.
                                   _M_p + lVar4));
        ghc::filesystem::path::u8string_abi_cxx11_(&local_70,&local_50);
        ghc::filesystem::path::~path(&local_50);
        bVar2 = executeTest(local_78,(path *)((long)&((local_d0.
                                                  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->_path)
                                                  ._M_dataplus._M_p + lVar4),&local_70,&local_b8);
        if (bVar2) {
          Logger::print<>("\x1b[1;32m");
          Logger::printLine<>("PASSED");
          local_d4 = local_d4 + 1;
        }
        else {
          Logger::print<>("\x1b[1;31m");
          Logger::printLine<>("FAILED");
          text._M_str = extraout_RDX;
          text._M_len = (size_t)local_b8._M_dataplus._M_p;
          Logger::printLine((Logger *)local_b8._M_string_length,text);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,
                          CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                   local_b8.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        lVar4 = lVar4 + 0x20;
      } while (pcVar3 < (pointer)((long)local_d0.
                                        super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_d0.
                                        super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    Logger::print<>("\x1b[1;0m");
    local_98._M_dataplus._M_p =
         (pointer)((long)local_d0.
                         super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_d0.
                         super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
    Logger::printLine<unsigned_int,unsigned_long>
              ("\n%d out of %d tests passed.",&local_d4,(unsigned_long *)&local_98);
    bVar2 = (long)local_d0.
                  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_d0.
                  super__Vector_base<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5 == (ulong)local_d4;
  }
  std::vector<ghc::filesystem::path,_std::allocator<ghc::filesystem::path>_>::~vector(&local_d0);
  return bVar2;
}

Assistant:

bool TestRunner::runTests(const fs::path& dir, const std::string& executableName)
{
	this->executableName = executableName;

	std::vector<fs::path> tests = getTestsList(dir);
	if (tests.empty())
	{
		Logger::printLine("No tests to run");
		return true;
	}

	unsigned int successCount = 0;
	for (size_t i = 0; i < tests.size(); i++)
	{
		changeConsoleColor(ConsoleColors::White);

		std::string line = tfm::format("Test %d of %d, %s:",i+1,tests.size(),tests[i].u8string());
		Logger::print("%-60s",line);

		std::string errors;

		std::string testName = tests[i].filename().u8string();
		if (!executeTest(tests[i],testName,errors))
		{
			changeConsoleColor(ConsoleColors::Red);
			Logger::printLine("FAILED");
			Logger::printLine(errors);
		} else {
			changeConsoleColor(ConsoleColors::Green);
			Logger::printLine("PASSED");
			successCount++;
		}
	}
	
	changeConsoleColor(ConsoleColors::White);
	Logger::printLine("\n%d out of %d tests passed.",successCount,tests.size());

	return successCount == tests.size();
}